

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void ge_equals_gej(secp256k1_ge *a,secp256k1_gej *b)

{
  secp256k1_fe *a_00;
  secp256k1_fe *a_01;
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  uint64_t uVar45;
  uint64_t uVar46;
  uint64_t uVar47;
  int iVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  secp256k1_gej *a_02;
  ulong uVar52;
  secp256k1_ge *a_03;
  ulong uVar53;
  ulong uVar54;
  secp256k1_fe s1;
  secp256k1_fe u1;
  secp256k1_fe s2;
  secp256k1_fe u2;
  secp256k1_fe z2s;
  undefined1 local_128 [96];
  secp256k1_gej local_c8;
  
  if (a->infinity == b->infinity) {
    if (a->infinity != 0) {
      return;
    }
    a_00 = &b->z;
    a_02 = b;
    a_03 = (secp256k1_ge *)a_00;
    secp256k1_fe_verify(a_00);
    if (8 < (b->z).magnitude) goto LAB_00128dff;
    a_01 = (secp256k1_fe *)(local_c8.z.n + 1);
    uVar51 = a_00->n[0];
    uVar54 = (b->z).n[1];
    uVar52 = (b->z).n[2];
    uVar53 = (b->z).n[3];
    uVar1 = (b->z).n[4];
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar51 * 2;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar53;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar54 * 2;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar52;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar1;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar1;
    uVar49 = SUB168(auVar4 * auVar24,0);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar49 & 0xfffffffffffff;
    auVar2 = auVar3 * auVar23 + auVar2 * auVar22 + auVar5 * ZEXT816(0x1000003d10);
    uVar50 = auVar2._0_8_;
    local_128._48_8_ = uVar50 & 0xfffffffffffff;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar50 >> 0x34 | auVar2._8_8_ << 0xc;
    uVar1 = uVar1 * 2;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar51;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar1;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar54 * 2;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar53;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar52;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar52;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar49 >> 0x34 | SUB168(auVar4 * auVar24,8) << 0xc;
    auVar2 = auVar6 * auVar25 + auVar38 + auVar7 * auVar26 + auVar8 * auVar27 +
             auVar9 * ZEXT816(0x1000003d10);
    uVar49 = auVar2._0_8_;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar49 >> 0x34 | auVar2._8_8_ << 0xc;
    local_128._0_8_ = (uVar49 & 0xfffffffffffff) >> 0x30;
    local_c8.y.n[0] = uVar49 & 0xffffffffffff;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar51;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar51;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar54;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar1;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar52 * 2;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar53;
    auVar2 = auVar11 * auVar29 + auVar39 + auVar12 * auVar30;
    uVar49 = auVar2._0_8_;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar49 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = (uVar49 & 0xfffffffffffff) << 4 | local_128._0_8_;
    auVar2 = auVar10 * auVar28 + ZEXT816(0x1000003d1) * auVar31;
    uVar49 = auVar2._0_8_;
    local_c8.z.n[1] = uVar49 & 0xfffffffffffff;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar49 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar51 * 2;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar54;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar52;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar1;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar53;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar53;
    auVar3 = auVar14 * auVar33 + auVar41 + auVar15 * auVar34;
    uVar49 = auVar3._0_8_;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar49 & 0xfffffffffffff;
    auVar2 = auVar13 * auVar32 + auVar40 + auVar16 * ZEXT816(0x1000003d10);
    uVar50 = auVar2._0_8_;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar49 >> 0x34 | auVar3._8_8_ << 0xc;
    local_c8.z.n[2] = uVar50 & 0xfffffffffffff;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar50 >> 0x34 | auVar2._8_8_ << 0xc;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar51 * 2;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar52;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar54;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar54;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar53;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar1;
    auVar43 = auVar19 * auVar37 + auVar43;
    uVar51 = auVar43._0_8_;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar51 & 0xfffffffffffff;
    auVar2 = auVar17 * auVar35 + auVar42 + auVar18 * auVar36 + auVar20 * ZEXT816(0x1000003d10);
    uVar54 = auVar2._0_8_;
    local_c8.z.n[3] = uVar54 & 0xfffffffffffff;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = (uVar54 >> 0x34 | auVar2._8_8_ << 0xc) + local_128._48_8_;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar51 >> 0x34 | auVar43._8_8_ << 0xc;
    auVar44 = auVar21 * ZEXT816(0x1000003d10) + auVar44;
    uVar51 = auVar44._0_8_;
    local_c8.z.n[4] = uVar51 & 0xfffffffffffff;
    local_c8.z._40_8_ = (uVar51 >> 0x34 | auVar44._8_8_ << 0xc) + local_c8.y.n[0];
    local_c8.infinity = 1;
    local_c8._148_4_ = 0;
    secp256k1_fe_verify(a_01);
    secp256k1_fe_mul((secp256k1_fe *)(local_128 + 0x30),&a->x,a_01);
    local_c8.y.n[0] = (b->x).n[0];
    local_c8.y.n[1] = (b->x).n[1];
    local_c8.y.n[2] = (b->x).n[2];
    local_c8.y.n[3] = (b->x).n[3];
    local_c8.y.n[4] = (b->x).n[4];
    local_c8.y.magnitude = (b->x).magnitude;
    local_c8.y.normalized = (b->x).normalized;
    a_02 = (secp256k1_gej *)&local_c8.y;
    secp256k1_fe_verify((secp256k1_fe *)a_02);
    uVar51 = (local_c8.y.n[4] >> 0x30) * 0x1000003d1 + local_c8.y.n[0];
    uVar54 = (uVar51 >> 0x34) + local_c8.y.n[1];
    uVar52 = (uVar54 >> 0x34) + local_c8.y.n[2];
    uVar53 = (uVar52 >> 0x34) + local_c8.y.n[3];
    local_c8.y.n[3] = uVar53 & 0xfffffffffffff;
    local_c8.y.n[4] = (uVar53 >> 0x34) + (local_c8.y.n[4] & 0xffffffffffff);
    local_c8.y.n[2] = uVar52 & 0xfffffffffffff;
    local_c8.y.n[1] = uVar54 & 0xfffffffffffff;
    local_c8.y.n[0] = uVar51 & 0xfffffffffffff;
    local_c8.y.magnitude = 1;
    secp256k1_fe_verify((secp256k1_fe *)a_02);
    secp256k1_fe_mul((secp256k1_fe *)local_128,&a->y,(secp256k1_fe *)(local_c8.z.n + 1));
    secp256k1_fe_mul((secp256k1_fe *)local_128,(secp256k1_fe *)local_128,a_00);
    local_c8.x.n[0] = (b->y).n[0];
    local_c8.x.n[1] = (b->y).n[1];
    local_c8.x.n[2] = (b->y).n[2];
    local_c8.x.n[3] = (b->y).n[3];
    local_c8.x.n[4] = (b->y).n[4];
    local_c8.x.magnitude = (b->y).magnitude;
    local_c8.x.normalized = (b->y).normalized;
    secp256k1_fe_verify(&local_c8.x);
    uVar51 = (local_c8.x.n[4] >> 0x30) * 0x1000003d1 + local_c8.x.n[0];
    uVar54 = (uVar51 >> 0x34) + local_c8.x.n[1];
    uVar52 = (uVar54 >> 0x34) + local_c8.x.n[2];
    uVar53 = (uVar52 >> 0x34) + local_c8.x.n[3];
    local_c8.x.n[3] = uVar53 & 0xfffffffffffff;
    local_c8.x.n[4] = (uVar53 >> 0x34) + (local_c8.x.n[4] & 0xffffffffffff);
    local_c8.x.n[2] = uVar52 & 0xfffffffffffff;
    local_c8.x.n[1] = uVar54 & 0xfffffffffffff;
    local_c8.x.n[0] = uVar51 & 0xfffffffffffff;
    local_c8.x.magnitude = 1;
    secp256k1_fe_verify(&local_c8.x);
    a_03 = (secp256k1_ge *)(local_128 + 0x30);
    iVar48 = secp256k1_fe_equal_var((secp256k1_fe *)a_03,(secp256k1_fe *)a_02);
    if (iVar48 != 0) {
      a_03 = (secp256k1_ge *)local_128;
      a_02 = &local_c8;
      iVar48 = secp256k1_fe_equal_var((secp256k1_fe *)a_03,&a_02->x);
      if (iVar48 != 0) {
        return;
      }
      goto LAB_00128e09;
    }
  }
  else {
    ge_equals_gej_cold_1();
    a_02 = b;
    a_03 = a;
LAB_00128dff:
    ge_equals_gej_cold_4();
  }
  ge_equals_gej_cold_3();
LAB_00128e09:
  ge_equals_gej_cold_2();
  uVar45 = (a_02->x).n[0];
  uVar46 = (a_02->x).n[1];
  uVar47 = (a_02->x).n[3];
  (a_03->x).n[2] = (a_02->x).n[2];
  (a_03->x).n[3] = uVar47;
  (a_03->x).n[0] = uVar45;
  (a_03->x).n[1] = uVar46;
  return;
}

Assistant:

static void ge_equals_gej(const secp256k1_ge *a, const secp256k1_gej *b) {
    secp256k1_fe z2s;
    secp256k1_fe u1, u2, s1, s2;
    CHECK(a->infinity == b->infinity);
    if (a->infinity) {
        return;
    }
    /* Check a.x * b.z^2 == b.x && a.y * b.z^3 == b.y, to avoid inverses. */
    secp256k1_fe_sqr(&z2s, &b->z);
    secp256k1_fe_mul(&u1, &a->x, &z2s);
    u2 = b->x; secp256k1_fe_normalize_weak(&u2);
    secp256k1_fe_mul(&s1, &a->y, &z2s); secp256k1_fe_mul(&s1, &s1, &b->z);
    s2 = b->y; secp256k1_fe_normalize_weak(&s2);
    CHECK(secp256k1_fe_equal_var(&u1, &u2));
    CHECK(secp256k1_fe_equal_var(&s1, &s2));
}